

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

vm_obj_id_t CVmObjStringConst::create(char *const_ptr)

{
  vm_obj_id_t obj_id;
  undefined8 *puVar1;
  
  obj_id = vm_new_id(0,0,0);
  puVar1 = (undefined8 *)CVmObject::operator_new(0x10,obj_id);
  *puVar1 = &PTR_get_metaclass_reg_003620c8;
  puVar1[1] = const_ptr;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjStringConst::create(VMG_ const char *const_ptr)
{
    /* create our new ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);

    /* create our string object, pointing directly to the constant pool */
    new (vmg_ id) CVmObjStringConst(vmg_ const_ptr);

    /* return the new ID */
    return id;
}